

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

Arg * __thiscall fmt::ArgList::operator[](Arg *__return_storage_ptr__,ArgList *this,uint index)

{
  LongLong *pLVar1;
  Arg *pAVar2;
  Type *pTVar3;
  ulong uVar4;
  uint uVar5;
  Arg *pAVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Type TVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  LongLong local_18;
  size_t sStack_10;
  
  uVar4 = this->types_;
  if (index < 0x10) {
    uVar8 = uVar4 >> ((char)index * '\x04' & 0x3fU);
    if ((uVar8 & 0xf) != 0) {
      pLVar1 = (LongLong *)
               ((long)&((this->field_1).values_)->field_0 +
               ((ulong)index << (uVar4 >> 0x3c == 0 ^ 5U)));
      local_18 = *pLVar1;
      sStack_10 = pLVar1[1];
    }
    (__return_storage_ptr__->super_Value).field_0.long_long_value = local_18;
    (__return_storage_ptr__->super_Value).field_0.string.size = sStack_10;
    __return_storage_ptr__->type = (Type)uVar8 & (CUSTOM|NAMED_ARG);
    return __return_storage_ptr__;
  }
  if (uVar4 >> 0x3c == 0) {
    __return_storage_ptr__->type = NONE;
    return __return_storage_ptr__;
  }
  pAVar6 = (this->field_1).args_;
  uVar5 = 0x10;
  do {
    uVar7 = uVar5;
    if (index < uVar7) {
      pAVar2 = pAVar6 + index;
      iVar9 = (pAVar2->super_Value).field_0.int_value;
      uVar10 = *(undefined4 *)((long)&(pAVar2->super_Value).field_0 + 4);
      uVar11 = *(undefined4 *)((long)&(pAVar2->super_Value).field_0 + 8);
      uVar12 = *(undefined4 *)((long)&(pAVar2->super_Value).field_0 + 0xc);
      pTVar3 = &pAVar6[index].type;
      TVar13 = *pTVar3;
      uVar14 = pTVar3[1];
      uVar15 = pTVar3[2];
      uVar16 = pTVar3[3];
      goto LAB_0010a59b;
    }
    uVar5 = uVar7 + 1;
  } while (pAVar6[uVar7].type != NONE);
  pAVar6 = pAVar6 + uVar7;
  iVar9 = (pAVar6->super_Value).field_0.int_value;
  uVar10 = *(undefined4 *)((long)&(pAVar6->super_Value).field_0 + 4);
  uVar11 = *(undefined4 *)((long)&(pAVar6->super_Value).field_0 + 8);
  uVar12 = *(undefined4 *)((long)&(pAVar6->super_Value).field_0 + 0xc);
  TVar13 = pAVar6->type;
  uVar14 = *(undefined4 *)&pAVar6->field_0x14;
  uVar15 = *(undefined4 *)&pAVar6->field_0x18;
  uVar16 = *(undefined4 *)&pAVar6->field_0x1c;
LAB_0010a59b:
  __return_storage_ptr__->type = TVar13;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar14;
  *(undefined4 *)&__return_storage_ptr__->field_0x18 = uVar15;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar16;
  (__return_storage_ptr__->super_Value).field_0.int_value = iVar9;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 4) = uVar10;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 8) = uVar11;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 0xc) = uVar12;
  return __return_storage_ptr__;
}

Assistant:

internal::Arg operator[](unsigned index) const
    {
        using internal::Arg;
        Arg arg;
        bool use_values = type(MAX_PACKED_ARGS - 1) == Arg::NONE;
        if (index < MAX_PACKED_ARGS)
        {
            Arg::Type arg_type = type(index);
            internal::Value &val = arg;
            if (arg_type != Arg::NONE)
                val = use_values ? values_[index] : args_[index];
            arg.type = arg_type;
            return arg;
        }
        if (use_values)
        {
            // The index is greater than the number of arguments that can be stored
            // in values, so return a "none" argument.
            arg.type = Arg::NONE;
            return arg;
        }
        for (unsigned i = MAX_PACKED_ARGS; i <= index; ++i)
        {
            if (args_[i].type == Arg::NONE)
                return args_[i];
        }
        return args_[index];
    }